

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O3

LinkIndex __thiscall
iDynTree::Traversal::getChildLinkIndexFromJointIndex(Traversal *this,Model *model,JointIndex jntIdx)

{
  Link *this_00;
  int iVar1;
  IJoint *pIVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  LinkIndex LVar5;
  long lVar3;
  
  pIVar2 = Model::getJoint(model,jntIdx);
  lVar3 = LINK_INVALID_INDEX;
  if (pIVar2 != (IJoint *)0x0) {
    iVar1 = (*pIVar2->_vptr_IJoint[7])(pIVar2);
    lVar3 = CONCAT44(extraout_var,iVar1);
    iVar1 = (*pIVar2->_vptr_IJoint[8])(pIVar2);
    lVar4 = (long)(this->linkIndexToTraversalIndex).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start[CONCAT44(extraout_var_00,iVar1)];
    if (((lVar4 != -1) &&
        (this_00 = (this->parents).
                   super__Vector_base<const_iDynTree::Link_*,_std::allocator<const_iDynTree::Link_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar4], this_00 != (Link *)0x0)) &&
       (LVar5 = Link::getIndex(this_00), LVar5 == lVar3)) {
      lVar3 = CONCAT44(extraout_var_00,iVar1);
    }
  }
  return lVar3;
}

Assistant:

LinkIndex Traversal::getChildLinkIndexFromJointIndex(const Model& model, const JointIndex jntIdx) const
{
    // Get the two links connected by this joint
    IJointConstPtr jnt = model.getJoint(jntIdx);
    if (!jnt)
    {
        return LINK_INVALID_INDEX;
    }

    LinkIndex link1 = jnt->getFirstAttachedLink();
    LinkIndex link2 = jnt->getSecondAttachedLink();

    // Get the traversal index of the child link (according to the traversal)
    LinkIndex childLink;
    if( this->isParentOf(link1,link2) )
    {
        childLink = link2;
    }
    else
    {
        childLink = link1;
    }

    return childLink;
}